

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayout::QDockAreaLayout(QDockAreaLayout *this,QMainWindow *win)

{
  undefined4 uVar1;
  QStyle *pQVar2;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  int tabShape;
  QDockAreaLayoutInfo *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar3;
  int tbshape;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 *puVar4;
  undefined4 in_stack_fffffffffffffdd8;
  QDockAreaLayoutInfo *in_stack_fffffffffffffde0;
  QDockAreaLayoutInfo *this_00;
  undefined4 *local_1e8;
  QDockAreaLayoutInfo local_158;
  undefined1 local_e8 [112];
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  local_1e8 = in_RDI + 0x10;
  do {
    QDockAreaLayoutInfo::QDockAreaLayoutInfo
              ((QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
    ;
    local_1e8 = local_1e8 + 0x1c;
  } while (local_1e8 != in_RDI + 0x80);
  *(undefined1 *)(in_RDI + 0x81) = 1;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x576a63);
  *(undefined8 *)(in_RDI + 10) = in_RSI;
  pQVar2 = QWidget::style((QWidget *)in_stack_fffffffffffffdb8);
  uVar3 = 0;
  uVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x10,0,in_RSI);
  in_RDI[0x80] = uVar1;
  uVar1 = 2;
  tbshape = (int)((ulong)local_78 >> 0x20);
  QDockAreaLayoutInfo::QDockAreaLayoutInfo
            (in_stack_fffffffffffffde0,(int *)CONCAT44(2,in_stack_fffffffffffffdd8),
             (DockPosition)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
             (Orientation)in_stack_fffffffffffffdd0,tbshape,
             (QMainWindow *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  QDockAreaLayoutInfo::operator=
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  puVar4 = local_e8;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo
            (in_stack_fffffffffffffde0,(int *)CONCAT44(uVar1,in_stack_fffffffffffffdd8),
             (DockPosition)((ulong)puVar4 >> 0x20),(Orientation)puVar4,tbshape,
             (QMainWindow *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  QDockAreaLayoutInfo::operator=
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  this_00 = &local_158;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo
            (this_00,(int *)CONCAT44(uVar1,in_stack_fffffffffffffdd8),
             (DockPosition)((ulong)puVar4 >> 0x20),(Orientation)puVar4,tbshape,
             (QMainWindow *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  QDockAreaLayoutInfo::operator=
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  QDockAreaLayoutInfo::QDockAreaLayoutInfo
            (this_00,(int *)CONCAT44(uVar1,in_stack_fffffffffffffdd8),
             (DockPosition)((ulong)puVar4 >> 0x20),(Orientation)puVar4,tbshape,
             (QMainWindow *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  QDockAreaLayoutInfo::operator=
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo
            ((QDockAreaLayoutInfo *)CONCAT44(uVar3,in_stack_fffffffffffffdc0));
  *(undefined8 *)(in_RDI + 8) = 0;
  *in_RDI = 4;
  in_RDI[1] = 4;
  in_RDI[2] = 8;
  in_RDI[3] = 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayout::QDockAreaLayout(QMainWindow *win) : fallbackToSizeHints(true)
{
    mainWindow = win;
    sep = win->style()->pixelMetric(QStyle::PM_DockWidgetSeparatorExtent, nullptr, win);
#if QT_CONFIG(tabbar)
    const int tabShape = QTabBar::RoundedSouth;
#else
    const int tabShape = 0;
#endif
    docks[QInternal::LeftDock]
        = QDockAreaLayoutInfo(&sep, QInternal::LeftDock, Qt::Vertical, tabShape, win);
    docks[QInternal::RightDock]
        = QDockAreaLayoutInfo(&sep, QInternal::RightDock, Qt::Vertical, tabShape, win);
    docks[QInternal::TopDock]
        = QDockAreaLayoutInfo(&sep, QInternal::TopDock, Qt::Horizontal, tabShape, win);
    docks[QInternal::BottomDock]
        = QDockAreaLayoutInfo(&sep, QInternal::BottomDock, Qt::Horizontal, tabShape, win);
    centralWidgetItem = nullptr;


    corners[Qt::TopLeftCorner] = Qt::TopDockWidgetArea;
    corners[Qt::TopRightCorner] = Qt::TopDockWidgetArea;
    corners[Qt::BottomLeftCorner] = Qt::BottomDockWidgetArea;
    corners[Qt::BottomRightCorner] = Qt::BottomDockWidgetArea;
}